

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O3

SUNErrCode
SUNLogger_QueueMsg(SUNLogger logger,SUNLogLevel lvl,char *scope,char *label,char *msg_txt,...)

{
  char *__ptr;
  char in_AL;
  SUNErrCode SVar1;
  FILE *__stream;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *log_msg;
  va_list args;
  char *local_f0;
  __va_list_tag local_e8;
  undefined1 local_c8 [40];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (logger == (SUNLogger)0x0) {
    return -9999;
  }
  local_e8.reg_save_area = local_c8;
  local_e8.overflow_arg_area = &log_msg;
  local_e8.gp_offset = 0x28;
  local_e8.fp_offset = 0x30;
  local_a0 = in_R9;
  if (logger->queuemsg !=
      (_func_SUNErrCode_SUNLogger_SUNLogLevel_char_ptr_char_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    SVar1 = (*logger->queuemsg)(logger,lvl,scope,label,msg_txt,&local_e8);
    return SVar1;
  }
  local_f0 = (char *)0x0;
  sunCreateLogMessage(lvl,0,scope,label,msg_txt,&local_e8,&local_f0);
  __ptr = local_f0;
  switch(lvl) {
  case SUN_LOGLEVEL_ERROR:
    __stream = (FILE *)logger->error_fp;
    break;
  case SUN_LOGLEVEL_WARNING:
    __stream = (FILE *)logger->warning_fp;
    break;
  case SUN_LOGLEVEL_INFO:
    __stream = (FILE *)logger->info_fp;
    break;
  case SUN_LOGLEVEL_DEBUG:
    __stream = (FILE *)logger->debug_fp;
    break;
  default:
    SVar1 = -0x26f8;
    goto LAB_001092cc;
  }
  SVar1 = 0;
  if (__stream != (FILE *)0x0) {
    fputs(local_f0,__stream);
  }
LAB_001092cc:
  free(__ptr);
  return SVar1;
}

Assistant:

SUNErrCode SUNLogger_QueueMsg(SUNLogger logger, SUNLogLevel lvl,
                              const char* scope, const char* label,
                              const char* msg_txt, ...)
{
  SUNErrCode retval = SUN_SUCCESS;

#if SUNDIALS_LOGGING_LEVEL > 0
  {
    if (!logger)
    {
      retval = SUN_ERR_ARG_CORRUPT;
      return retval;
    }

    va_list args;
    va_start(args, msg_txt);

    if (logger->queuemsg)
    {
      retval = logger->queuemsg(logger, lvl, scope, label, msg_txt, args);
    }
    else
    {
      /* Default implementation */
      int rank = 0;
      if (sunLoggerIsOutputRank(logger, &rank))
      {
        char* log_msg = NULL;
        sunCreateLogMessage(lvl, rank, scope, label, msg_txt, args, &log_msg);

        switch (lvl)
        {
        case (SUN_LOGLEVEL_DEBUG):
          if (logger->debug_fp) { fprintf(logger->debug_fp, "%s", log_msg); }
          break;
        case (SUN_LOGLEVEL_WARNING):
          if (logger->warning_fp)
          {
            fprintf(logger->warning_fp, "%s", log_msg);
          }
          break;
        case (SUN_LOGLEVEL_INFO):
          if (logger->info_fp) { fprintf(logger->info_fp, "%s", log_msg); }
          break;
        case (SUN_LOGLEVEL_ERROR):
          if (logger->error_fp) { fprintf(logger->error_fp, "%s", log_msg); }
          break;
        default: retval = SUN_ERR_UNREACHABLE;
        }

        free(log_msg);
      }
    }

    va_end(args);
  }
#else
  /* silence warnings when all logging is disabled */
  ((void)logger);
  ((void)lvl);
  ((void)scope);
  ((void)label);
  ((void)msg_txt);
#endif

  return retval;
}